

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

DdNode * Llb_CoreComputeCube(DdManager *dd,Vec_Int_t *vVars,int fUseVarIndex,char *pValues)

{
  abctime aVar1;
  int iVar2;
  DdNode *pDVar3;
  bool local_65;
  int local_64;
  abctime TimeStop;
  int Index;
  int iVar;
  int i;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bRes;
  char *pValues_local;
  int fUseVarIndex_local;
  Vec_Int_t *vVars_local;
  DdManager *dd_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  for (Index = 0; iVar2 = Vec_IntSize(vVars), Index < iVar2; Index = Index + 1) {
    local_64 = Vec_IntEntry(vVars,Index);
    if (fUseVarIndex == 0) {
      local_64 = Index;
    }
    pDVar3 = Cudd_bddIthVar(dd,local_64);
    local_65 = true;
    if (pValues != (char *)0x0) {
      local_65 = pValues[Index] != '\x01';
    }
    pDVar3 = Cudd_bddAnd(dd,bVar,(DdNode *)((ulong)pDVar3 ^ (long)(int)(uint)local_65));
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bVar);
    bVar = pDVar3;
  }
  Cudd_Deref(bVar);
  dd->TimeStop = aVar1;
  return bVar;
}

Assistant:

DdNode * Llb_CoreComputeCube( DdManager * dd, Vec_Int_t * vVars, int fUseVarIndex, char * pValues )
{
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar, Index;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Vec_IntForEachEntry( vVars, Index, i )
    {
        iVar  = fUseVarIndex ? Index : i;
        bVar  = Cudd_NotCond( Cudd_bddIthVar(dd, iVar), (int)(pValues == NULL || pValues[i] != 1) );
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}